

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void applyAffinity(Mem *pRec,char affinity,u8 enc)

{
  ushort uVar1;
  
  if (affinity < 'C') {
    if (affinity == 'B') {
      if ((pRec->flags & 0x2c) != 0 && (char)((pRec->flags & 2) >> 1) == '\0') {
        sqlite3VdbeMemStringify(pRec,enc,'\x01');
      }
      *(byte *)&pRec->flags = (byte)pRec->flags & 0xd3;
    }
  }
  else {
    uVar1 = pRec->flags;
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 0x28) == 0) {
        if ((uVar1 & 2) != 0) {
          applyNumericAffinity(pRec,1);
          return;
        }
      }
      else if (affinity < 'F') {
        sqlite3VdbeIntegerAffinity(pRec);
        return;
      }
    }
  }
  return;
}

Assistant:

static void applyAffinity(
  Mem *pRec,          /* The value to apply affinity to */
  char affinity,      /* The affinity to be applied */
  u8 enc              /* Use this text encoding */
){
  if( affinity>=SQLITE_AFF_NUMERIC ){
    assert( affinity==SQLITE_AFF_INTEGER || affinity==SQLITE_AFF_REAL
             || affinity==SQLITE_AFF_NUMERIC || affinity==SQLITE_AFF_FLEXNUM );
    if( (pRec->flags & MEM_Int)==0 ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags & (MEM_Real|MEM_IntReal))==0 ){
        if( pRec->flags & MEM_Str ) applyNumericAffinity(pRec,1);
      }else if( affinity<=SQLITE_AFF_REAL ){
        sqlite3VdbeIntegerAffinity(pRec);
      }
    }
  }else if( affinity==SQLITE_AFF_TEXT ){
    /* Only attempt the conversion to TEXT if there is an integer or real
    ** representation (blob and NULL do not get converted) but no string
    ** representation.  It would be harmless to repeat the conversion if
    ** there is already a string rep, but it is pointless to waste those
    ** CPU cycles. */
    if( 0==(pRec->flags&MEM_Str) ){ /*OPTIMIZATION-IF-FALSE*/
      if( (pRec->flags&(MEM_Real|MEM_Int|MEM_IntReal)) ){
        testcase( pRec->flags & MEM_Int );
        testcase( pRec->flags & MEM_Real );
        testcase( pRec->flags & MEM_IntReal );
        sqlite3VdbeMemStringify(pRec, enc, 1);
      }
    }
    pRec->flags &= ~(MEM_Real|MEM_Int|MEM_IntReal);
  }
}